

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::ClearKey(FConfigFile *this,char *key)

{
  char *pcVar1;
  FConfigSection *pFVar2;
  FConfigSection *pFVar3;
  int iVar4;
  
  pFVar2 = this->CurrentSection;
  pFVar3 = (FConfigSection *)this->CurrentSection->RootEntry;
  while( true ) {
    if (pFVar3 == (FConfigSection *)0x0) {
      return;
    }
    iVar4 = strcasecmp((char *)&pFVar3->LastEntryPtr,key);
    if (iVar4 == 0) break;
    pFVar2 = pFVar3;
    pFVar3 = (FConfigSection *)pFVar3->RootEntry;
  }
  pFVar2->RootEntry = pFVar3->RootEntry;
  if (this->CurrentSection->LastEntryPtr == &pFVar3->RootEntry) {
    this->CurrentSection->LastEntryPtr = &pFVar2->RootEntry;
  }
  pcVar1 = (pFVar3->SectionName).Chars;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  operator_delete__(pFVar3);
  return;
}

Assistant:

void FConfigFile::ClearKey(const char *key)
{
	if (CurrentSection->RootEntry == NULL)
	{
		return;
	}
	FConfigEntry **prober = &CurrentSection->RootEntry, *probe = *prober;

	while (probe != NULL && stricmp(probe->Key, key) != 0)
	{
		prober = &probe->Next;
		probe = *prober;
	}
	if (probe != NULL)
	{
		*prober = probe->Next;
		if (CurrentSection->LastEntryPtr == &probe->Next)
		{
			CurrentSection->LastEntryPtr = prober;
		}
		delete[] probe->Value;
		delete[] (char *)probe;
	}
}